

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

void __thiscall QUtcTimeZonePrivate::QUtcTimeZonePrivate(QUtcTimeZonePrivate *this)

{
  long in_FS_OFFSET;
  QArrayData *local_40;
  char *local_38;
  undefined8 local_30;
  QArrayData *local_28;
  char16_t *local_20;
  undefined8 local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QTimeZonePrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  (this->super_QTimeZonePrivate).m_id.d.d = (Data *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.ptr = (char *)0x0;
  (this->super_QTimeZonePrivate).m_id.d.size = 0;
  (this->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QUtcTimeZonePrivate_0069f5f8;
  (this->m_name).d.d = (Data *)0x0;
  (this->m_name).d.ptr = (char16_t *)0x0;
  (this->m_name).d.size = 0;
  (this->m_abbreviation).d.d = (Data *)0x0;
  (this->m_abbreviation).d.ptr = (char16_t *)0x0;
  (this->m_abbreviation).d.size = 0;
  (this->m_comment).d.d = (Data *)0x0;
  (this->m_comment).d.ptr = (char16_t *)0x0;
  (this->m_comment).d.size = 0;
  local_28 = (QArrayData *)0x0;
  local_20 = L"UTC";
  local_18 = 3;
  local_40 = (QArrayData *)0x0;
  local_38 = "UTC";
  local_30 = 3;
  init(this,(EVP_PKEY_CTX *)&local_40);
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,1,0x10);
    }
  }
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUtcTimeZonePrivate::QUtcTimeZonePrivate()
{
    const QString name = utcQString();
    init(utcQByteArray(), 0, name, name, QLocale::AnyTerritory, name);
}